

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *weights)

{
  char cVar1;
  uint uVar2;
  uint32_t code;
  pointer piVar3;
  pointer piVar4;
  pointer ppVar5;
  Node **ppNVar6;
  pointer puVar7;
  pair<int,_int> pVar8;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> _Var9;
  invalid_argument *piVar10;
  long *plVar11;
  pair<int,_int> pVar12;
  uint32_t i;
  ulong uVar13;
  int *__args;
  pointer ppVar14;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> tail;
  pair<int,_int> *it;
  pair<int,_int> pVar15;
  Node **kt_1;
  Node **__args_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *weights_00;
  Node *curr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid;
  pointer jt;
  Node *begin;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> local_80;
  Node *local_78;
  iterator iStack_70;
  uint *local_68;
  pair<int,_int> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> local_48;
  Node *local_40;
  Node *local_38;
  
  if (sequence_len != 0) {
    if ((long)(weights->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(weights->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)sequence_len) {
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar10,
                 "[spoa::Graph::AddAlignment] error: sequence and weights are of unequal size!");
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    piVar3 = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      if (piVar3[sequence[uVar13]] == -1) {
        uVar2 = this->num_codes_;
        piVar3[sequence[uVar13]] = uVar2;
        cVar1 = sequence[uVar13];
        this->num_codes_ = uVar2 + 1;
        piVar4[uVar2] = (int)cVar1;
      }
      uVar13 = uVar13 + 1;
    } while (sequence_len != uVar13);
    ppVar14 = (alignment->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (alignment->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    local_50 = weights;
    if (ppVar14 == ppVar5) {
      local_78 = AddSequence(this,sequence,weights,0,sequence_len);
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 &local_78);
      TopologicalSort(this);
    }
    else {
      local_78 = (Node *)0x0;
      iStack_70._M_current = (uint *)0x0;
      local_68 = (uint *)0x0;
      __args = &ppVar14->second;
      local_58 = (pair<int,_int>)alignment;
      do {
        uVar2 = *__args;
        if (uVar2 != 0xffffffff) {
          if (((int)uVar2 < 0) || ((int)sequence_len <= (int)uVar2)) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar10,"[spoa::Graph::AddAlignment] error: invalid alignment");
            __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (iStack_70._M_current == local_68) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,iStack_70,
                       __args);
          }
          else {
            *iStack_70._M_current = uVar2;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        weights_00 = local_50;
        ppVar14 = (pointer)(__args + 1);
        __args = __args + 2;
      } while (ppVar14 != ppVar5);
      if (local_78 == (Node *)iStack_70._M_current) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar10,"[spoa::Graph::AddAlignment] error: missing sequence in alignment");
        __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      local_40 = AddSequence(this,sequence,local_50,0,local_78->id);
      if (local_40 == (Node *)0x0) {
        _Var9._M_head_impl = (Node *)0x0;
      }
      else {
        _Var9._M_head_impl =
             (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
             super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
             super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
      }
      local_38 = AddSequence(this,sequence,weights_00,
                             *(int *)((long)&(((Node *)((long)iStack_70._M_current + -0x50))->
                                             aligned_nodes).
                                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             + 1,sequence_len);
      pVar15 = *(pair<int,_int> *)local_58;
      pVar12 = *(pair<int,_int> *)((long)local_58 + 8);
      tail._M_head_impl = _Var9._M_head_impl;
      pVar8 = pVar12;
      if (pVar15 != pVar12) {
        do {
          local_58 = pVar8;
          _Var9._M_head_impl = tail._M_head_impl;
          if ((long)*(int *)((long)pVar15 + 4) != -1) {
            code = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[sequence[*(int *)((long)pVar15 + 4)]];
            local_80._M_head_impl = (Node *)0x0;
            if ((long)*(int *)pVar15 == -1) {
              _Var9._M_head_impl = AddNode(this,code);
            }
            else {
              local_48._M_head_impl =
                   *(Node **)&(this->nodes_).
                              super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[*(int *)pVar15]._M_t.
                              super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                              ._M_t;
              _Var9._M_head_impl = local_48._M_head_impl;
              if (*(uint32_t *)((long)local_48._M_head_impl + 4) != code) {
                for (plVar11 = *(long **)((long)local_48._M_head_impl + 0x38);
                    plVar11 != *(long **)((long)local_48._M_head_impl + 0x40); plVar11 = plVar11 + 1
                    ) {
                  _Var9._M_head_impl = (Node *)*plVar11;
                  if (((Node *)*plVar11)->code == code) goto LAB_0010849a;
                }
                local_80._M_head_impl = AddNode(this,code);
                ppNVar6 = *(pointer *)
                           ((long)&((local_48._M_head_impl)->aligned_nodes).
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           + 8);
                for (__args_00 = *(Node ***)
                                  &((local_48._M_head_impl)->aligned_nodes).
                                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                   ._M_impl; __args_00 != ppNVar6; __args_00 = __args_00 + 1) {
                  std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  emplace_back<spoa::Graph::Node*&>
                            ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &(*__args_00)->aligned_nodes,&local_80._M_head_impl);
                  std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  emplace_back<spoa::Graph::Node*const&>
                            ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &(local_80._M_head_impl)->aligned_nodes,__args_00);
                }
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           ((long)local_48._M_head_impl + 0x38),&local_80._M_head_impl);
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &(local_80._M_head_impl)->aligned_nodes,&local_48._M_head_impl);
                pVar12 = local_58;
                weights_00 = local_50;
                _Var9._M_head_impl = local_80._M_head_impl;
              }
            }
LAB_0010849a:
            local_80._M_head_impl = _Var9._M_head_impl;
            if (local_40 == (Node *)0x0) {
              local_40 = local_80._M_head_impl;
            }
            _Var9._M_head_impl = local_80._M_head_impl;
            if (tail._M_head_impl != (Node *)0x0) {
              puVar7 = (weights_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              AddEdge(this,tail._M_head_impl,local_80._M_head_impl,
                      puVar7[*(int *)((long)pVar15 + 4)] +
                      puVar7[(long)*(int *)((long)pVar15 + 4) + -1]);
              _Var9._M_head_impl = local_80._M_head_impl;
            }
          }
          pVar15 = (pair<int,_int>)((long)pVar15 + 8);
          tail._M_head_impl = _Var9._M_head_impl;
          pVar8 = local_58;
        } while (pVar15 != pVar12);
      }
      if (local_38 != (Node *)0x0) {
        puVar7 = (weights_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)((long)&(((Node *)((long)iStack_70._M_current + -0x50))->aligned_nodes).
                                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        AddEdge(this,_Var9._M_head_impl,local_38,puVar7[uVar2 + 1] + puVar7[uVar2]);
      }
      std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
      emplace_back<spoa::Graph::Node*&>
                ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&this->sequences_,
                 &local_40);
      TopologicalSort(this);
      if (local_78 != (Node *)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
    }
  }
  return;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const std::vector<std::uint32_t>& weights) {
  if (sequence_len == 0) {
    return;
  }
  if (sequence_len != weights.size()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: "
        "sequence and weights are of unequal size!");
  }

  for (std::uint32_t i = 0; i < sequence_len; ++i) {
    if (coder_[sequence[i]] == -1) {
      coder_[sequence[i]] = num_codes_;
      decoder_[num_codes_++] = sequence[i];
    }
  }

  if (alignment.empty()) {
    sequences_.emplace_back(AddSequence(sequence, weights, 0, sequence_len));
    TopologicalSort();
    return;
  }

  std::vector<std::uint32_t> valid;
  for (const auto& it : alignment) {
    if (it.second != -1) {
      if (it.second < 0 || it.second >= static_cast<std::int32_t>(sequence_len)) {  // NOLINT
        throw std::invalid_argument(
            "[spoa::Graph::AddAlignment] error: invalid alignment");
      }
      valid.emplace_back(it.second);
    }
  }
  if (valid.empty()) {
    throw std::invalid_argument(
        "[spoa::Graph::AddAlignment] error: missing sequence in alignment");
  }

  // add unaligned bases
  Node* begin = AddSequence(sequence, weights, 0, valid.front());
  Node* prev = begin ? nodes_.back().get() : nullptr;
  Node* last = AddSequence(sequence, weights, valid.back() + 1, sequence_len);

  // add aligned bases
  for (const auto& it : alignment) {
    if (it.second == -1) {
      continue;
    }

    std::uint32_t code = coder_[sequence[it.second]];
    Node* curr = nullptr;
    if (it.first == -1) {
      curr = AddNode(code);
    } else {
      auto jt = nodes_[it.first].get();
      if (jt->code == code) {
        curr = jt;
      } else {
        for (const auto& kt : jt->aligned_nodes) {
          if (kt->code == code) {
            curr = kt;
            break;
          }
        }
        if (!curr) {
          curr = AddNode(code);
          for (const auto& kt : jt->aligned_nodes) {
            kt->aligned_nodes.emplace_back(curr);
            curr->aligned_nodes.emplace_back(kt);
          }
          jt->aligned_nodes.emplace_back(curr);
          curr->aligned_nodes.emplace_back(jt);
        }
      }
    }
    if (!begin) {
      begin = curr;
    }
    if (prev) {  // both nodes contribute to weight
      AddEdge(prev, curr, weights[it.second - 1] + weights[it.second]);
    }
    prev = curr;
  }
  if (last) {
    AddEdge(prev, last, weights[valid.back()] + weights[valid.back() + 1]);
  }
  sequences_.emplace_back(begin);

  TopologicalSort();
}